

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_buildBlockEntropyStats_sequences
                 (seqStore_t *seqStorePtr,ZSTD_fseCTables_t *prevEntropy,
                 ZSTD_fseCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,
                 ZSTD_fseCTablesMetadata_t *fseMetadata,void *workspace,size_t wkspSize)

{
  uint uVar1;
  size_t nbSeq_00;
  size_t err_code;
  undefined1 local_e8 [32];
  ZSTD_symbolEncodingTypeStats_t local_c8;
  ZSTD_symbolEncodingTypeStats_t stats;
  size_t entropyWorkspaceSize;
  uint *entropyWorkspace;
  uint *countWorkspace;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  size_t nbSeq;
  ZSTD_strategy strategy;
  void *workspace_local;
  ZSTD_fseCTablesMetadata_t *fseMetadata_local;
  ZSTD_CCtx_params *cctxParams_local;
  ZSTD_fseCTables_t *nextEntropy_local;
  ZSTD_fseCTables_t *prevEntropy_local;
  seqStore_t *seqStorePtr_local;
  
  nbSeq_00 = (long)seqStorePtr->sequences - (long)seqStorePtr->sequencesStart >> 3;
  stats.lastCountSize = wkspSize - 0xd4;
  if (nbSeq_00 == 0) {
    ZSTD_buildDummySequencesStatistics((ZSTD_symbolEncodingTypeStats_t *)&err_code,nextEntropy);
    local_c8.lastCountSize = err_code;
    stats.LLtype = local_e8._0_4_;
    stats.Offtype = local_e8._4_4_;
    stats._8_8_ = local_e8._8_8_;
    stats.size = local_e8._16_8_;
  }
  else {
    ZSTD_buildSequencesStatistics
              ((ZSTD_symbolEncodingTypeStats_t *)(local_e8 + 0x18),seqStorePtr,nbSeq_00,prevEntropy,
               nextEntropy,fseMetadata->fseTablesBuffer,&fseMetadata->field_0x91,
               (cctxParams->cParams).strategy,(uint *)workspace,(void *)((long)workspace + 0xd4),
               stats.lastCountSize);
    local_c8.lastCountSize = local_e8._24_8_;
    stats.LLtype = local_c8.LLtype;
    stats.Offtype = local_c8.Offtype;
    stats.MLtype = local_c8.MLtype;
    stats._12_4_ = local_c8._12_4_;
    stats.size = local_c8.size;
  }
  seqStorePtr_local = (seqStore_t *)stats._8_8_;
  uVar1 = ERR_isError(stats._8_8_);
  if (uVar1 == 0) {
    fseMetadata->llType = (symbolEncodingType_e)local_c8.lastCountSize;
    fseMetadata->ofType = local_c8.lastCountSize._4_4_;
    fseMetadata->mlType = stats.LLtype;
    fseMetadata->lastCountSize = stats.size;
    seqStorePtr_local = (seqStore_t *)stats._8_8_;
  }
  else {
  }
  return (size_t)seqStorePtr_local;
}

Assistant:

static size_t ZSTD_buildBlockEntropyStats_sequences(seqStore_t* seqStorePtr,
                                              const ZSTD_fseCTables_t* prevEntropy,
                                                    ZSTD_fseCTables_t* nextEntropy,
                                              const ZSTD_CCtx_params* cctxParams,
                                                    ZSTD_fseCTablesMetadata_t* fseMetadata,
                                                    void* workspace, size_t wkspSize)
{
    ZSTD_strategy const strategy = cctxParams->cParams.strategy;
    size_t const nbSeq = seqStorePtr->sequences - seqStorePtr->sequencesStart;
    BYTE* const ostart = fseMetadata->fseTablesBuffer;
    BYTE* const oend = ostart + sizeof(fseMetadata->fseTablesBuffer);
    BYTE* op = ostart;
    unsigned* countWorkspace = (unsigned*)workspace;
    unsigned* entropyWorkspace = countWorkspace + (MaxSeq + 1);
    size_t entropyWorkspaceSize = wkspSize - (MaxSeq + 1) * sizeof(*countWorkspace);
    ZSTD_symbolEncodingTypeStats_t stats;

    DEBUGLOG(5, "ZSTD_buildBlockEntropyStats_sequences (nbSeq=%zu)", nbSeq);
    stats = nbSeq != 0 ? ZSTD_buildSequencesStatistics(seqStorePtr, nbSeq,
                                          prevEntropy, nextEntropy, op, oend,
                                          strategy, countWorkspace,
                                          entropyWorkspace, entropyWorkspaceSize)
                       : ZSTD_buildDummySequencesStatistics(nextEntropy);
    FORWARD_IF_ERROR(stats.size, "ZSTD_buildSequencesStatistics failed!");
    fseMetadata->llType = (symbolEncodingType_e) stats.LLtype;
    fseMetadata->ofType = (symbolEncodingType_e) stats.Offtype;
    fseMetadata->mlType = (symbolEncodingType_e) stats.MLtype;
    fseMetadata->lastCountSize = stats.lastCountSize;
    return stats.size;
}